

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestStreamWriterTestwriteZeroes::runTestCase(TestStreamWriterTestwriteZeroes *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestResult *pTVar4;
  Value *pVVar5;
  char *pcVar6;
  string out;
  string binary;
  Value root;
  string expected;
  StreamWriterBuilder b;
  string local_178;
  string local_158;
  string local_138;
  Value local_118;
  string local_f0;
  undefined1 *local_d0;
  unsigned_long local_c8;
  undefined1 local_c0 [16];
  StreamWriterBuilder local_b0;
  Value local_80;
  Value local_58;
  
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138.field_2._M_allocated_capacity._0_4_ = 0x6968;
  local_138._M_string_length = 3;
  JsonTest::checkEqual<int,unsigned_long>
            ((this->super_StreamWriterTest).super_TestCase.result_,3,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x680,"3 == binary.length()");
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\"hi\\u0000\"","");
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_b0);
  Json::Value::Value(&local_118,nullValue);
  Json::Value::Value(&local_58,&local_138);
  Json::Value::operator=(&local_118,&local_58);
  Json::Value::~Value(&local_58);
  pTVar4 = (this->super_StreamWriterTest).super_TestCase.result_;
  paVar1 = &local_178.field_2;
  local_178._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  Json::Value::asString_abi_cxx11_(&local_158,&local_118);
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  JsonTest::checkStringEqual
            (pTVar4,&local_178,&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x686,"binary == root.asString()");
  paVar2 = &local_158.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar1) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  Json::writeString_abi_cxx11_(&local_178,(Json *)&local_b0,(Factory *)&local_118,(Value *)pcVar6);
  JsonTest::checkEqual<unsigned_long,unsigned_long>
            ((this->super_StreamWriterTest).super_TestCase.result_,local_c8,
             local_178._M_string_length,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x688,"expected.size() == out.size()");
  pTVar4 = (this->super_StreamWriterTest).super_TestCase.result_;
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_d0,local_d0 + local_c8);
  paVar3 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_178._M_dataplus._M_p,
             local_178._M_dataplus._M_p + local_178._M_string_length);
  JsonTest::checkStringEqual
            (pTVar4,&local_158,&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x689,"expected == out");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar1) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  Json::Value::~Value(&local_118);
  Json::Value::Value(&local_118,nullValue);
  Json::Value::Value(&local_80,&local_138);
  pVVar5 = Json::Value::operator[](&local_118,"top");
  Json::Value::operator=(pVVar5,&local_80);
  Json::Value::~Value(&local_80);
  pTVar4 = (this->super_StreamWriterTest).super_TestCase.result_;
  local_178._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  pVVar5 = Json::Value::operator[](&local_118,"top");
  Json::Value::asString_abi_cxx11_(&local_158,pVVar5);
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  JsonTest::checkStringEqual
            (pTVar4,&local_178,&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x68e,"binary == root[\"top\"].asString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar1) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  pVVar5 = Json::Value::operator[](&local_118,"top");
  Json::writeString_abi_cxx11_(&local_178,(Json *)&local_b0,(Factory *)pVVar5,(Value *)pcVar6);
  pTVar4 = (this->super_StreamWriterTest).super_TestCase.result_;
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_d0,local_d0 + local_c8);
  local_f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_178._M_dataplus._M_p,
             local_178._M_dataplus._M_p + local_178._M_string_length);
  JsonTest::checkStringEqual
            (pTVar4,&local_158,&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x690,"expected == out");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar1) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  Json::Value::~Value(&local_118);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_b0);
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  return;
}

Assistant:

JSONTEST_FIXTURE(StreamWriterTest, writeZeroes) {
  std::string binary("hi", 3);  // include trailing 0
  JSONTEST_ASSERT_EQUAL(3, binary.length());
  std::string expected("\"hi\\u0000\"");  // unicoded zero
  Json::StreamWriterBuilder b;
  {
    Json::Value root;
    root = binary;
    JSONTEST_ASSERT_STRING_EQUAL(binary, root.asString());
    std::string out = Json::writeString(b, root);
    JSONTEST_ASSERT_EQUAL(expected.size(), out.size());
    JSONTEST_ASSERT_STRING_EQUAL(expected, out);
  }
  {
    Json::Value root;
    root["top"] = binary;
    JSONTEST_ASSERT_STRING_EQUAL(binary, root["top"].asString());
    std::string out = Json::writeString(b, root["top"]);
    JSONTEST_ASSERT_STRING_EQUAL(expected, out);
  }
}